

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractprintdialog.cpp
# Opt level: O1

void __thiscall QPrintDialog::done(QPrintDialog *this,int result)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  undefined4 *puVar4;
  char *pcVar5;
  QObject *pQVar6;
  long in_FS_OFFSET;
  QObject local_50 [8];
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (result == 1) {
    local_48 = QDialog::accepted;
    local_40 = 0;
    puVar4 = (undefined4 *)operator_new(0x18);
    *puVar4 = 1;
    *(code **)(puVar4 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/printsupport/dialogs/qabstractprintdialog.cpp:372:58),_QtPrivate::List<>,_void>
         ::impl;
    *(QPrintDialog **)(puVar4 + 4) = this;
    QObject::connectImpl
              (local_50,(void **)this,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar4,(int *)0x100,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_50);
  }
  QDialog::done((int)this);
  lVar2 = *(long *)(lVar1 + 0x2f0);
  if (((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (*(long *)(lVar1 + 0x2f8) != 0)) {
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      pQVar6 = (QObject *)0x0;
    }
    else {
      pQVar6 = *(QObject **)(lVar1 + 0x2f8);
    }
    pcVar5 = *(char **)(lVar1 + 0x308);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)&QByteArray::_empty;
    }
    QObject::disconnect((QObject *)this,"2accepted(QPrinter*)",pQVar6,pcVar5);
    piVar3 = *(int **)(lVar1 + 0x2f0);
    *(undefined8 *)(lVar1 + 0x2f0) = 0;
    *(undefined8 *)(lVar1 + 0x2f8) = 0;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        operator_delete(piVar3);
      }
    }
  }
  QByteArray::clear();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintDialog::done(int result)
{
    auto *d = static_cast<QAbstractPrintDialogPrivate *>(d_ptr.data());
    if (result == Accepted) {
        // Emit accepted(QPrinter*) at the same time as the dialog
        // is accepted. Doing it here is too late, as done() will
        // also emit finished().
        QObject::connect(this, &QDialog::accepted, this, [this]{
            emit accepted(printer());
        }, Qt::SingleShotConnection);
    }
    QDialog::done(result);
    if (d->receiverToDisconnectOnClose) {
        disconnect(this, SIGNAL(accepted(QPrinter*)),
                   d->receiverToDisconnectOnClose, d->memberToDisconnectOnClose);
        d->receiverToDisconnectOnClose = nullptr;
    }
    d->memberToDisconnectOnClose.clear();
}